

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

size_t MakeUncompressedStream(uint8_t *input,size_t input_size,uint8_t *output)

{
  size_t sVar1;
  uint uVar2;
  uint local_50;
  uint32_t bits;
  uint32_t chunk_size;
  uint32_t nibbles;
  size_t offset;
  size_t result;
  size_t size;
  uint8_t *output_local;
  size_t input_size_local;
  uint8_t *input_local;
  
  _chunk_size = 0;
  if (input_size == 0) {
    *output = '\x06';
    input_local = (uint8_t *)0x1;
  }
  else {
    *output = '!';
    offset = 2;
    output[1] = '\x03';
    for (result = input_size; result != 0; result = result - local_50) {
      bits = 0;
      if (result < 0x1000001) {
        local_50 = (uint)result;
      }
      else {
        local_50 = 0x1000000;
      }
      if ((0x10000 < local_50) && (bits = 1, 0x100000 < local_50)) {
        bits = 2;
      }
      uVar2 = bits << 1 | (local_50 - 1) * 8 | 1 << ((char)(bits << 2) + 0x13U & 0x1f);
      output[offset] = (uint8_t)uVar2;
      output[offset + 1] = (uint8_t)(uVar2 >> 8);
      output[offset + 2] = (uint8_t)(uVar2 >> 0x10);
      sVar1 = offset + 3;
      if (bits == 2) {
        output[offset + 3] = (uint8_t)(uVar2 >> 0x18);
        sVar1 = offset + 4;
      }
      offset = sVar1;
      memcpy(output + offset,input + _chunk_size,(ulong)local_50);
      offset = local_50 + offset;
      _chunk_size = (ulong)local_50 + _chunk_size;
    }
    input_local = (uint8_t *)(offset + 1);
    output[offset] = '\x03';
  }
  return (size_t)input_local;
}

Assistant:

static size_t MakeUncompressedStream(
    const uint8_t* input, size_t input_size, uint8_t* output) {
  size_t size = input_size;
  size_t result = 0;
  size_t offset = 0;
  if (input_size == 0) {
    output[0] = 6;
    return 1;
  }
  output[result++] = 0x21;  /* window bits = 10, is_last = false */
  output[result++] = 0x03;  /* empty metadata, padding */
  while (size > 0) {
    uint32_t nibbles = 0;
    uint32_t chunk_size;
    uint32_t bits;
    chunk_size = (size > (1u << 24)) ? (1u << 24) : (uint32_t)size;
    if (chunk_size > (1u << 16)) nibbles = (chunk_size > (1u << 20)) ? 2 : 1;
    bits =
        (nibbles << 1) | ((chunk_size - 1) << 3) | (1u << (19 + 4 * nibbles));
    output[result++] = (uint8_t)bits;
    output[result++] = (uint8_t)(bits >> 8);
    output[result++] = (uint8_t)(bits >> 16);
    if (nibbles == 2) output[result++] = (uint8_t)(bits >> 24);
    memcpy(&output[result], &input[offset], chunk_size);
    result += chunk_size;
    offset += chunk_size;
    size -= chunk_size;
  }
  output[result++] = 3;
  return result;
}